

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O1

bool cmFortranParser_FilePop(cmFortranParser *parser)

{
  _Elt_pointer pcVar1;
  _Elt_pointer pcVar2;
  pointer pcVar3;
  FILE *__stream;
  YY_BUFFER_STATE new_buffer;
  YY_BUFFER_STATE b;
  _Elt_pointer pcVar4;
  cmFortranFile f;
  long *local_58 [2];
  long local_48 [2];
  undefined1 local_38;
  
  pcVar1 = (parser->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  pcVar2 = (parser->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pcVar2 != pcVar1) {
    pcVar4 = pcVar2;
    if (pcVar2 == (parser->FileStack).c.
                  super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pcVar4 = (parser->FileStack).c.
               super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 9;
    }
    __stream = (FILE *)pcVar4[-1].File;
    new_buffer = pcVar4[-1].Buffer;
    pcVar3 = pcVar4[-1].Directory._M_dataplus._M_p;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar3,pcVar3 + pcVar4[-1].Directory._M_string_length);
    local_38 = pcVar4[-1].LastCharWasNewline;
    std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>::pop_back(&(parser->FileStack).c);
    fclose(__stream);
    b = cmFortranLexer_GetCurrentBuffer(parser->Scanner);
    cmFortran_yy_delete_buffer(b,parser->Scanner);
    cmFortran_yy_switch_to_buffer(new_buffer,parser->Scanner);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
  }
  return pcVar2 != pcVar1;
}

Assistant:

void cmFortranParser_RuleIfndef(cmFortranParser* parser, const char* macro)
{
  // A new PP branch has been opened
  parser->SkipToEnd.push(false);

  if (parser->InPPFalseBranch) {
    parser->InPPFalseBranch++;
  } else if (parser->PPDefinitions.find(macro) !=
             parser->PPDefinitions.end()) {
    parser->InPPFalseBranch = 1;
  } else {
    // ignore other branches
    parser->SkipToEnd.top() = true;
  }
}